

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_complexity.c
# Opt level: O1

void av1_caq_select_segment
               (AV1_COMP *cpi,MACROBLOCK *mb,BLOCK_SIZE bs,int mi_row,int mi_col,int projected_rate)

{
  long lVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  SequenceHeader *pSVar6;
  int16_t iVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint8_t *__s;
  uint uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  int local_40;
  
  if (((((((cpi->common).current_frame.frame_type & 0xfd) == 0) ||
        ((cpi->common).features.error_resilient_mode != false)) ||
       ((cpi->refresh_frame).alt_ref_frame != false)) ||
      (((cpi->refresh_frame).golden_frame == true && ((cpi->rc).is_src_frame_alt_ref == 0)))) &&
     (iVar3 = (cpi->rc).sb64_target_rate, 0xff < iVar3)) {
    pSVar6 = (cpi->common).seq_params;
    uVar2 = pSVar6->monochrome;
    iVar4 = (cpi->common).mi_params.mi_cols;
    uVar11 = iVar4 - mi_col;
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bs]
        <= (int)uVar11) {
      uVar11 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                     [bs];
    }
    uVar10 = (cpi->common).mi_params.mi_rows - mi_row;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[bs]
        <= (int)uVar10) {
      uVar10 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bs];
    }
    iVar5 = pSVar6->mib_size;
    iVar7 = av1_ac_quant_QTX((cpi->common).quant_params.base_qindex,0,pSVar6->bit_depth);
    if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
      dVar14 = 10.0;
    }
    else {
      dVar13 = exp((cpi->twopass_frame).mb_av_energy);
      dVar14 = 8.0;
      if (8.0 < dVar13) {
        dVar14 = exp((cpi->twopass_frame).mb_av_energy);
      }
    }
    av1_setup_src_planes(mb,cpi->source,mi_row,mi_col,(uint)(uVar2 == '\0') * 2 + 1,bs);
    iVar8 = av1_log_block_var(cpi,mb,bs);
    local_40 = (int)(((long)(int)(iVar3 * uVar11 * uVar10) << 9) /
                    (long)(ulong)(uint)(iVar5 * iVar5));
    lVar9 = 0;
    do {
      lVar1 = (ulong)(((uint)(0x67 < iVar7) + (uint)(0x2b < iVar7)) * 8) * 5 + lVar9 * 8;
      if (((double)projected_rate <
           *(double *)((long)aq_c_transitions[0] + lVar1) * (double)local_40) &&
         ((double)iVar8 < *(double *)((long)aq_c_var_thresholds[0] + lVar1) + dVar14))
      goto LAB_003b111d;
      lVar9 = lVar9 + 1;
    } while (lVar9 != 5);
    lVar9 = 4;
LAB_003b111d:
    if (0 < (int)uVar10) {
      __s = (cpi->enc_seg).map + (iVar4 * mi_row + mi_col);
      iVar3 = (cpi->common).mi_params.mi_cols;
      uVar12 = (ulong)uVar10;
      do {
        memset(__s,(uint)lVar9 & 0xff,(long)(int)uVar11);
        __s = __s + iVar3;
        uVar12 = uVar12 - 1;
      } while (uVar12 != 0);
    }
  }
  return;
}

Assistant:

void av1_caq_select_segment(const AV1_COMP *cpi, MACROBLOCK *mb, BLOCK_SIZE bs,
                            int mi_row, int mi_col, int projected_rate) {
  if ((!is_frame_aq_enabled(cpi)) || (!is_sb_aq_enabled(cpi))) return;
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);

  const int mi_offset = mi_row * cm->mi_params.mi_cols + mi_col;
  const int xmis = AOMMIN(cm->mi_params.mi_cols - mi_col, mi_size_wide[bs]);
  const int ymis = AOMMIN(cm->mi_params.mi_rows - mi_row, mi_size_high[bs]);
  int i;
  unsigned char segment;

  // Rate depends on fraction of a SB64 in frame (xmis * ymis / bw * bh).
  // It is converted to bits << AV1_PROB_COST_SHIFT units.
  const int64_t num = (int64_t)(cpi->rc.sb64_target_rate * xmis * ymis)
                      << AV1_PROB_COST_SHIFT;
  const int denom = cm->seq_params->mib_size * cm->seq_params->mib_size;
  const int target_rate = (int)(num / denom);
  double logvar;
  double low_var_thresh;
  const int aq_strength = get_aq_c_strength(cm->quant_params.base_qindex,
                                            cm->seq_params->bit_depth);

  low_var_thresh =
      (is_stat_consumption_stage_twopass(cpi))
          ? AOMMAX(exp(cpi->twopass_frame.mb_av_energy), MIN_DEFAULT_LV_THRESH)
          : DEFAULT_LV_THRESH;

  av1_setup_src_planes(mb, cpi->source, mi_row, mi_col, num_planes, bs);
  logvar = av1_log_block_var(cpi, mb, bs);

  segment = AQ_C_SEGMENTS - 1;  // Just in case no break out below.
  for (i = 0; i < AQ_C_SEGMENTS; ++i) {
    // Test rate against a threshold value and variance against a threshold.
    // Increasing segment number (higher variance and complexity) = higher Q.
    if ((projected_rate < target_rate * aq_c_transitions[aq_strength][i]) &&
        (logvar < (low_var_thresh + aq_c_var_thresholds[aq_strength][i]))) {
      segment = i;
      break;
    }
  }

  // Fill in the entires in the segment map corresponding to this SB64.
  const int mi_stride = cm->mi_params.mi_cols;
  set_segment_id(cpi->enc_seg.map, mi_offset, xmis, ymis, mi_stride, segment);
}